

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse42::BVHNIntersector1<4,_16781328,_true,_embree::sse42::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  undefined8 uVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 (*pauVar17) [16];
  undefined8 uVar18;
  AABBNodeMB4D *node1;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  undefined1 (*pauVar23) [16];
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  undefined4 uVar27;
  ulong unaff_R15;
  undefined4 uVar28;
  int iVar29;
  float fVar30;
  float fVar31;
  float fVar49;
  float fVar51;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar50;
  float fVar52;
  float fVar53;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  vint4 bi;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar58;
  float fVar59;
  float fVar68;
  float fVar70;
  vfloat4 a0;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar69;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  vint4 ai_3;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar83;
  float fVar84;
  undefined1 auVar80 [16];
  float fVar85;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar86;
  float fVar91;
  float fVar92;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar93;
  float fVar94;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar99;
  float fVar100;
  vint4 ai;
  undefined1 auVar98 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  vint4 bi_1;
  float fVar104;
  float fVar105;
  float fVar106;
  vint4 ai_1;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  vfloat<4> tNear;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  undefined1 local_1108 [8];
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  RayHit *local_10c0;
  Intersectors *local_10b8;
  RayQueryContext *local_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  undefined1 local_1058 [16];
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_10b0 = context;
  local_10b8 = This;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    aVar6 = (ray->super_RayK<1>).dir.field_0.field_1;
    local_1038 = aVar6.x;
    local_1048 = aVar6.y;
    local_1028 = aVar6.z;
    auVar32 = dpps((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
    auVar60 = rsqrtss(auVar32,auVar32);
    fVar30 = auVar60._0_4_;
    local_fb8[0] = fVar30 * 1.5 - fVar30 * fVar30 * auVar32._0_4_ * 0.5 * fVar30;
    auVar82._0_4_ = local_1038 * local_fb8[0];
    auVar82._4_4_ = local_1048 * local_fb8[0];
    auVar82._8_4_ = local_1028 * local_fb8[0];
    auVar82._12_4_ = aVar6.field_3.w * local_fb8[0];
    uVar22 = CONCAT44(auVar82._4_4_,auVar82._4_4_);
    auVar33._0_8_ = uVar22 ^ 0x8000000080000000;
    auVar33._8_4_ = -auVar82._12_4_;
    auVar33._12_4_ = -auVar82._12_4_;
    auVar90._0_12_ = ZEXT812(0);
    auVar90._12_4_ = 0;
    auVar33 = blendps(auVar33,auVar90,0xe);
    auVar32._4_4_ = auVar33._0_4_;
    auVar32._0_4_ = auVar82._8_4_;
    auVar32._8_4_ = auVar33._4_4_;
    auVar32._12_4_ = 0;
    auVar60._4_4_ = auVar33._0_4_;
    auVar60._0_4_ = auVar82._8_4_;
    auVar60._8_4_ = auVar33._4_4_;
    auVar60._12_4_ = 0;
    auVar102 = dpps(auVar60 << 0x20,auVar32 << 0x20,0x7f);
    uVar22 = CONCAT44(auVar82._12_4_,auVar82._8_4_);
    auVar87._0_8_ = uVar22 ^ 0x8000000080000000;
    auVar87._8_4_ = -auVar82._8_4_;
    auVar87._12_4_ = -auVar82._12_4_;
    auVar33 = insertps(auVar87,auVar82,0x2a);
    auVar60 = dpps(auVar33,auVar33,0x7f);
    iVar29 = -(uint)(auVar60._0_4_ < auVar102._0_4_);
    auVar102._4_4_ = iVar29;
    auVar102._0_4_ = iVar29;
    auVar102._8_4_ = iVar29;
    auVar102._12_4_ = iVar29;
    auVar32 = blendvps(auVar33,auVar32 << 0x20,auVar102);
    auVar60 = dpps(auVar32,auVar32,0x7f);
    auVar33 = rsqrtss(auVar60,auVar60);
    fVar30 = auVar33._0_4_;
    fVar30 = fVar30 * 1.5 - fVar30 * fVar30 * auVar60._0_4_ * 0.5 * fVar30;
    fVar31 = fVar30 * auVar32._0_4_;
    fVar49 = fVar30 * auVar32._4_4_;
    fVar51 = fVar30 * auVar32._8_4_;
    fVar30 = fVar30 * auVar32._12_4_;
    fVar86 = fVar49 * auVar82._0_4_ - auVar82._4_4_ * fVar31;
    fVar91 = fVar51 * auVar82._4_4_ - auVar82._8_4_ * fVar49;
    fVar92 = fVar31 * auVar82._8_4_ - auVar82._0_4_ * fVar51;
    auVar88._12_4_ = fVar30 * auVar82._12_4_ - auVar82._12_4_ * fVar30;
    auVar88._0_8_ = CONCAT44(fVar92,fVar91);
    auVar88._8_4_ = fVar86;
    auVar98._8_4_ = fVar86;
    auVar98._0_8_ = auVar88._0_8_;
    auVar98._12_4_ = auVar88._12_4_;
    auVar32 = dpps(auVar98,auVar88,0x7f);
    auVar60 = rsqrtss(auVar32,auVar32);
    fVar30 = auVar60._0_4_;
    fVar30 = fVar30 * 1.5 - fVar30 * fVar30 * auVar32._0_4_ * 0.5 * fVar30;
    local_f88._4_4_ = fVar30 * fVar86;
    local_f88._0_4_ = fVar51;
    local_f88._8_4_ = auVar82._8_4_ * local_fb8[0];
    local_f88._12_4_ = 0;
    local_f98._4_4_ = fVar30 * fVar92;
    local_f98._0_4_ = fVar49;
    local_f98._8_4_ = auVar82._4_4_ * local_fb8[0];
    local_f98._12_4_ = 0;
    local_fa8._4_4_ = fVar30 * fVar91;
    local_fa8._0_4_ = fVar31;
    local_fa8._8_4_ = auVar82._0_4_ * local_fb8[0];
    local_fa8._12_4_ = 0;
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      fVar30 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      fVar31 = 0.0;
      if (0.0 <= fVar30) {
        fVar31 = fVar30;
      }
      pauVar23 = (undefined1 (*) [16])local_f68;
      fVar30 = (ray->super_RayK<1>).tfar;
      fVar49 = 0.0;
      if (0.0 <= fVar30) {
        fVar49 = fVar30;
      }
      auVar34._4_4_ = -(uint)(ABS(local_1048) < 1e-18);
      auVar34._0_4_ = -(uint)(ABS(local_1038) < 1e-18);
      auVar34._8_4_ = -(uint)(ABS(local_1028) < 1e-18);
      auVar34._12_4_ = -(uint)(ABS(aVar6.field_3.w) < 1e-18);
      fVar30 = (ray->super_RayK<1>).org.field_0.m128[0];
      fVar51 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_10f8 = (ray->super_RayK<1>).org.field_0.m128[2];
      auVar32 = divps(_DAT_01feca10,(undefined1  [16])aVar6);
      auVar32 = blendvps(auVar32,_DAT_0201c930,auVar34);
      local_1088 = auVar32._0_4_ * 0.99999964;
      local_1098 = auVar32._4_4_ * 0.99999964;
      local_1078 = auVar32._8_4_ * 0.99999964;
      local_10d8 = auVar32._0_4_ * 1.0000004;
      local_10e8 = auVar32._4_4_ * 1.0000004;
      local_1068 = auVar32._8_4_ * 1.0000004;
      fStack_1034 = local_1038;
      fStack_1030 = local_1038;
      fStack_102c = local_1038;
      fStack_1044 = local_1048;
      fStack_1040 = local_1048;
      fStack_103c = local_1048;
      fStack_1024 = local_1028;
      fStack_1020 = local_1028;
      fStack_101c = local_1028;
      uVar22 = (ulong)(local_1088 < 0.0) * 0x10;
      uVar25 = (ulong)(local_1098 < 0.0) << 4 | 0x20;
      uVar26 = (ulong)(local_1078 < 0.0) << 4 | 0x40;
      local_1058._4_4_ = fVar31;
      local_1058._0_4_ = fVar31;
      local_1058._8_4_ = fVar31;
      local_1058._12_4_ = fVar31;
      fStack_10f4 = local_10f8;
      fStack_10f0 = local_10f8;
      fStack_10ec = local_10f8;
      fStack_1064 = local_1068;
      fStack_1060 = local_1068;
      fStack_105c = local_1068;
      fStack_1074 = local_1078;
      fStack_1070 = local_1078;
      fStack_106c = local_1078;
      fStack_1084 = local_1088;
      fStack_1080 = local_1088;
      fStack_107c = local_1088;
      fStack_1094 = local_1098;
      fStack_1090 = local_1098;
      fStack_108c = local_1098;
      fStack_10d4 = local_10d8;
      fStack_10d0 = local_10d8;
      fStack_10cc = local_10d8;
      fStack_10e4 = local_10e8;
      fStack_10e0 = local_10e8;
      fStack_10dc = local_10e8;
      local_10c0 = ray;
      fVar31 = fVar49;
      fVar86 = fVar49;
      fVar91 = fVar49;
      auVar32 = local_1058;
      fVar92 = local_1088;
      fVar108 = local_1088;
      fVar109 = local_1088;
      fVar110 = local_1088;
      fVar83 = local_1078;
      fVar50 = local_1078;
      fVar93 = local_1078;
      fVar84 = local_1078;
      fVar52 = local_10f8;
      fVar94 = local_10f8;
      fVar85 = local_10f8;
      fVar53 = local_10f8;
      fVar58 = local_1098;
      fVar59 = local_1098;
      fVar68 = local_1098;
      fVar69 = local_1098;
      fVar70 = local_10d8;
      fVar71 = local_10d8;
      fVar72 = local_10d8;
      fVar73 = local_10d8;
      fVar95 = local_10e8;
      fVar96 = local_10e8;
      fVar97 = local_10e8;
      fVar99 = local_10e8;
      fVar100 = local_1068;
      fVar104 = local_1068;
      fVar105 = local_1068;
      fVar106 = local_1068;
      do {
        do {
          if (pauVar23 == (undefined1 (*) [16])&local_f78) {
            return;
          }
          pauVar17 = pauVar23 + -1;
          pauVar23 = pauVar23 + -1;
        } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar17 + 8));
        uVar20 = *(ulong *)*pauVar23;
        do {
          if ((uVar20 & 8) == 0) {
            fVar5 = (ray->super_RayK<1>).dir.field_0.m128[3];
            uVar21 = (uint)uVar20 & 7;
            uVar19 = uVar20 & 0xfffffffffffffff0;
            uVar28 = (undefined4)(unaff_R15 >> 0x20);
            if (uVar21 == 3) {
              local_fd8 = *(float *)(uVar19 + 0x20);
              fStack_fd4 = *(float *)(uVar19 + 0x24);
              fStack_fd0 = *(float *)(uVar19 + 0x28);
              fStack_fcc = *(float *)(uVar19 + 0x2c);
              local_ff8 = *(float *)(uVar19 + 0x50);
              fStack_ff4 = *(float *)(uVar19 + 0x54);
              fStack_ff0 = *(float *)(uVar19 + 0x58);
              fStack_fec = *(float *)(uVar19 + 0x5c);
              local_fe8 = *(float *)(uVar19 + 0x60);
              fStack_fe4 = *(float *)(uVar19 + 100);
              fStack_fe0 = *(float *)(uVar19 + 0x68);
              fStack_fdc = *(float *)(uVar19 + 0x6c);
              local_1018 = *(float *)(uVar19 + 0x80);
              fStack_1014 = *(float *)(uVar19 + 0x84);
              fStack_1010 = *(float *)(uVar19 + 0x88);
              fStack_100c = *(float *)(uVar19 + 0x8c);
              local_1008 = *(float *)(uVar19 + 0x90);
              fStack_1004 = *(float *)(uVar19 + 0x94);
              fStack_1000 = *(float *)(uVar19 + 0x98);
              fStack_ffc = *(float *)(uVar19 + 0x9c);
              local_10a8 = *(undefined8 *)(uVar19 + 0xa0);
              uStack_10a0 = *(undefined8 *)(uVar19 + 0xa8);
              uVar10 = local_10a8;
              uVar18 = uStack_10a0;
              fVar95 = 1.0 - fVar5;
              fVar96 = fVar95 * 0.0;
              local_fc8 = *(float *)(uVar19 + 0xf0) * fVar5 + fVar96;
              fStack_fc4 = *(float *)(uVar19 + 0xf4) * fVar5 + fVar96;
              fStack_fc0 = *(float *)(uVar19 + 0xf8) * fVar5 + fVar96;
              fStack_fbc = *(float *)(uVar19 + 0xfc) * fVar5 + fVar96;
              auVar101._0_4_ =
                   local_1038 * local_fd8 + local_1048 * local_ff8 + local_1028 * local_1018;
              auVar101._4_4_ =
                   fStack_1034 * fStack_fd4 + fStack_1044 * fStack_ff4 + fStack_1024 * fStack_1014;
              auVar101._8_4_ =
                   fStack_1030 * fStack_fd0 + fStack_1040 * fStack_ff0 + fStack_1020 * fStack_1010;
              auVar101._12_4_ =
                   fStack_102c * fStack_fcc + fStack_103c * fStack_fec + fStack_101c * fStack_100c;
              fVar92 = (float)DAT_01ff1d40;
              fVar108 = DAT_01ff1d40._4_4_;
              fVar109 = DAT_01ff1d40._8_4_;
              fVar110 = DAT_01ff1d40._12_4_;
              auVar36._4_4_ = -(uint)(ABS(auVar101._4_4_) < fVar108);
              auVar36._0_4_ = -(uint)(ABS(auVar101._0_4_) < fVar92);
              auVar36._8_4_ = -(uint)(ABS(auVar101._8_4_) < fVar109);
              auVar36._12_4_ = -(uint)(ABS(auVar101._12_4_) < fVar110);
              auVar102 = blendvps(auVar101,_DAT_01ff1d40,auVar36);
              local_1138 = (float)*(undefined8 *)(uVar19 + 0x30);
              fStack_1134 = (float)((ulong)*(undefined8 *)(uVar19 + 0x30) >> 0x20);
              fStack_1130 = (float)*(undefined8 *)(uVar19 + 0x38);
              fStack_112c = (float)((ulong)*(undefined8 *)(uVar19 + 0x38) >> 0x20);
              auVar76._0_4_ =
                   local_1038 * local_1138 + local_1048 * local_fe8 + local_1028 * local_1008;
              auVar76._4_4_ =
                   fStack_1034 * fStack_1134 + fStack_1044 * fStack_fe4 + fStack_1024 * fStack_1004;
              auVar76._8_4_ =
                   fStack_1030 * fStack_1130 + fStack_1040 * fStack_fe0 + fStack_1020 * fStack_1000;
              auVar76._12_4_ =
                   fStack_102c * fStack_112c + fStack_103c * fStack_fdc + fStack_101c * fStack_ffc;
              auVar37._4_4_ = -(uint)(ABS(auVar76._4_4_) < fVar108);
              auVar37._0_4_ = -(uint)(ABS(auVar76._0_4_) < fVar92);
              auVar37._8_4_ = -(uint)(ABS(auVar76._8_4_) < fVar109);
              auVar37._12_4_ = -(uint)(ABS(auVar76._12_4_) < fVar110);
              auVar33 = blendvps(auVar76,_DAT_01ff1d40,auVar37);
              local_10a8._4_4_ = (float)((ulong)local_10a8 >> 0x20);
              uStack_10a0._4_4_ = (float)((ulong)uStack_10a0 >> 0x20);
              auVar64._0_4_ =
                   local_1038 * *(float *)(uVar19 + 0x40) +
                   local_1048 * *(float *)(uVar19 + 0x70) + local_1028 * (float)local_10a8;
              auVar64._4_4_ =
                   fStack_1034 * *(float *)(uVar19 + 0x44) +
                   fStack_1044 * *(float *)(uVar19 + 0x74) + fStack_1024 * local_10a8._4_4_;
              auVar64._8_4_ =
                   fStack_1030 * *(float *)(uVar19 + 0x48) +
                   fStack_1040 * *(float *)(uVar19 + 0x78) + fStack_1020 * (float)uStack_10a0;
              auVar64._12_4_ =
                   fStack_102c * *(float *)(uVar19 + 0x4c) +
                   fStack_103c * *(float *)(uVar19 + 0x7c) + fStack_101c * uStack_10a0._4_4_;
              auVar38._4_4_ = -(uint)(ABS(auVar64._4_4_) < fVar108);
              auVar38._0_4_ = -(uint)(ABS(auVar64._0_4_) < fVar92);
              auVar38._8_4_ = -(uint)(ABS(auVar64._8_4_) < fVar109);
              auVar38._12_4_ = -(uint)(ABS(auVar64._12_4_) < fVar110);
              auVar60 = blendvps(auVar64,_DAT_01ff1d40,auVar38);
              auVar32 = rcpps(auVar38,auVar102);
              fVar92 = auVar32._0_4_;
              fVar110 = auVar32._4_4_;
              fVar93 = auVar32._8_4_;
              fVar94 = auVar32._12_4_;
              fVar92 = (1.0 - auVar102._0_4_ * fVar92) * fVar92 + fVar92;
              fVar110 = (1.0 - auVar102._4_4_ * fVar110) * fVar110 + fVar110;
              fVar93 = (1.0 - auVar102._8_4_ * fVar93) * fVar93 + fVar93;
              fVar94 = (1.0 - auVar102._12_4_ * fVar94) * fVar94 + fVar94;
              auVar32 = rcpps(auVar32,auVar33);
              fVar108 = auVar32._0_4_;
              auVar77._0_4_ = auVar33._0_4_ * fVar108;
              fVar83 = auVar32._4_4_;
              auVar77._4_4_ = auVar33._4_4_ * fVar83;
              fVar84 = auVar32._8_4_;
              auVar77._8_4_ = auVar33._8_4_ * fVar84;
              fVar85 = auVar32._12_4_;
              auVar77._12_4_ = auVar33._12_4_ * fVar85;
              fVar108 = (1.0 - auVar77._0_4_) * fVar108 + fVar108;
              fVar83 = (1.0 - auVar77._4_4_) * fVar83 + fVar83;
              fVar84 = (1.0 - auVar77._8_4_) * fVar84 + fVar84;
              fVar85 = (1.0 - auVar77._12_4_) * fVar85 + fVar85;
              auVar32 = rcpps(auVar77,auVar60);
              fVar109 = auVar32._0_4_;
              fVar50 = auVar32._4_4_;
              fVar52 = auVar32._8_4_;
              fVar53 = auVar32._12_4_;
              fVar109 = (1.0 - auVar60._0_4_ * fVar109) * fVar109 + fVar109;
              fVar50 = (1.0 - auVar60._4_4_ * fVar50) * fVar50 + fVar50;
              fVar52 = (1.0 - auVar60._8_4_ * fVar52) * fVar52 + fVar52;
              fVar53 = (1.0 - auVar60._12_4_ * fVar53) * fVar53 + fVar53;
              fVar58 = local_fd8 * fVar30 +
                       local_ff8 * fVar51 + local_1018 * local_10f8 + *(float *)(uVar19 + 0xb0);
              fVar68 = fStack_fd4 * fVar30 +
                       fStack_ff4 * fVar51 + fStack_1014 * fStack_10f4 + *(float *)(uVar19 + 0xb4);
              fVar70 = fStack_fd0 * fVar30 +
                       fStack_ff0 * fVar51 + fStack_1010 * fStack_10f0 + *(float *)(uVar19 + 0xb8);
              fVar72 = fStack_fcc * fVar30 +
                       fStack_fec * fVar51 + fStack_100c * fStack_10ec + *(float *)(uVar19 + 0xbc);
              fVar59 = local_1138 * fVar30 +
                       local_fe8 * fVar51 + local_1008 * local_10f8 + *(float *)(uVar19 + 0xc0);
              fVar69 = fStack_1134 * fVar30 +
                       fStack_fe4 * fVar51 + fStack_1004 * fStack_10f4 + *(float *)(uVar19 + 0xc4);
              fVar71 = fStack_1130 * fVar30 +
                       fStack_fe0 * fVar51 + fStack_1000 * fStack_10f0 + *(float *)(uVar19 + 200);
              fVar73 = fStack_112c * fVar30 +
                       fStack_fdc * fVar51 + fStack_ffc * fStack_10ec + *(float *)(uVar19 + 0xcc);
              fVar111 = *(float *)(uVar19 + 0x40) * fVar30 +
                        *(float *)(uVar19 + 0x70) * fVar51 +
                        (float)local_10a8 * local_10f8 + *(float *)(uVar19 + 0xd0);
              fVar112 = *(float *)(uVar19 + 0x44) * fVar30 +
                        *(float *)(uVar19 + 0x74) * fVar51 +
                        local_10a8._4_4_ * fStack_10f4 + *(float *)(uVar19 + 0xd4);
              fVar113 = *(float *)(uVar19 + 0x48) * fVar30 +
                        *(float *)(uVar19 + 0x78) * fVar51 +
                        (float)uStack_10a0 * fStack_10f0 + *(float *)(uVar19 + 0xd8);
              fVar114 = *(float *)(uVar19 + 0x4c) * fVar30 +
                        *(float *)(uVar19 + 0x7c) * fVar51 +
                        uStack_10a0._4_4_ * fStack_10ec + *(float *)(uVar19 + 0xdc);
              fVar104 = ((*(float *)(uVar19 + 0xe0) * fVar5 + fVar96) - fVar58) * fVar92;
              fVar105 = ((*(float *)(uVar19 + 0xe4) * fVar5 + fVar96) - fVar68) * fVar110;
              fVar106 = ((*(float *)(uVar19 + 0xe8) * fVar5 + fVar96) - fVar70) * fVar93;
              fVar107 = ((*(float *)(uVar19 + 0xec) * fVar5 + fVar96) - fVar72) * fVar94;
              fVar92 = ((*(float *)(uVar19 + 0x110) * fVar5 + fVar95) - fVar58) * fVar92;
              fVar110 = ((*(float *)(uVar19 + 0x114) * fVar5 + fVar95) - fVar68) * fVar110;
              fVar93 = ((*(float *)(uVar19 + 0x118) * fVar5 + fVar95) - fVar70) * fVar93;
              fVar94 = ((*(float *)(uVar19 + 0x11c) * fVar5 + fVar95) - fVar72) * fVar94;
              fVar58 = (local_fc8 - fVar59) * fVar108;
              fVar68 = (fStack_fc4 - fVar69) * fVar83;
              fVar70 = (fStack_fc0 - fVar71) * fVar84;
              fVar72 = (fStack_fbc - fVar73) * fVar85;
              fVar97 = ((fVar96 + *(float *)(uVar19 + 0x100) * fVar5) - fVar111) * fVar109;
              fVar99 = ((fVar96 + *(float *)(uVar19 + 0x104) * fVar5) - fVar112) * fVar50;
              fVar100 = ((fVar96 + *(float *)(uVar19 + 0x108) * fVar5) - fVar113) * fVar52;
              fVar96 = ((fVar96 + *(float *)(uVar19 + 0x10c) * fVar5) - fVar114) * fVar53;
              fVar108 = ((*(float *)(uVar19 + 0x120) * fVar5 + fVar95) - fVar59) * fVar108;
              fVar83 = ((*(float *)(uVar19 + 0x124) * fVar5 + fVar95) - fVar69) * fVar83;
              fVar84 = ((*(float *)(uVar19 + 0x128) * fVar5 + fVar95) - fVar71) * fVar84;
              fVar85 = ((*(float *)(uVar19 + 300) * fVar5 + fVar95) - fVar73) * fVar85;
              fVar109 = ((fVar5 * *(float *)(uVar19 + 0x130) + fVar95) - fVar111) * fVar109;
              fVar50 = ((fVar5 * *(float *)(uVar19 + 0x134) + fVar95) - fVar112) * fVar50;
              fVar52 = ((fVar5 * *(float *)(uVar19 + 0x138) + fVar95) - fVar113) * fVar52;
              fVar53 = ((fVar5 * *(float *)(uVar19 + 0x13c) + fVar95) - fVar114) * fVar53;
              auVar39._0_4_ =
                   (uint)((int)fVar108 < (int)fVar58) * (int)fVar108 |
                   (uint)((int)fVar108 >= (int)fVar58) * (int)fVar58;
              auVar39._4_4_ =
                   (uint)((int)fVar83 < (int)fVar68) * (int)fVar83 |
                   (uint)((int)fVar83 >= (int)fVar68) * (int)fVar68;
              auVar39._8_4_ =
                   (uint)((int)fVar84 < (int)fVar70) * (int)fVar84 |
                   (uint)((int)fVar84 >= (int)fVar70) * (int)fVar70;
              auVar39._12_4_ =
                   (uint)((int)fVar85 < (int)fVar72) * (int)fVar85 |
                   (uint)((int)fVar85 >= (int)fVar72) * (int)fVar72;
              auVar65._0_4_ =
                   (uint)((int)fVar109 < (int)fVar97) * (int)fVar109 |
                   (uint)((int)fVar109 >= (int)fVar97) * (int)fVar97;
              auVar65._4_4_ =
                   (uint)((int)fVar50 < (int)fVar99) * (int)fVar50 |
                   (uint)((int)fVar50 >= (int)fVar99) * (int)fVar99;
              auVar65._8_4_ =
                   (uint)((int)fVar52 < (int)fVar100) * (int)fVar52 |
                   (uint)((int)fVar52 >= (int)fVar100) * (int)fVar100;
              auVar65._12_4_ =
                   (uint)((int)fVar53 < (int)fVar96) * (int)fVar53 |
                   (uint)((int)fVar53 >= (int)fVar96) * (int)fVar96;
              auVar32 = maxps(auVar39,auVar65);
              auVar66._0_4_ =
                   (uint)((int)fVar92 < (int)fVar104) * (int)fVar92 |
                   (uint)((int)fVar92 >= (int)fVar104) * (int)fVar104;
              auVar66._4_4_ =
                   (uint)((int)fVar110 < (int)fVar105) * (int)fVar110 |
                   (uint)((int)fVar110 >= (int)fVar105) * (int)fVar105;
              auVar66._8_4_ =
                   (uint)((int)fVar93 < (int)fVar106) * (int)fVar93 |
                   (uint)((int)fVar93 >= (int)fVar106) * (int)fVar106;
              auVar66._12_4_ =
                   (uint)((int)fVar94 < (int)fVar107) * (int)fVar94 |
                   (uint)((int)fVar94 >= (int)fVar107) * (int)fVar107;
              auVar103._0_4_ =
                   (uint)((int)fVar108 < (int)fVar58) * (int)fVar58 |
                   (uint)((int)fVar108 >= (int)fVar58) * (int)fVar108;
              auVar103._4_4_ =
                   (uint)((int)fVar83 < (int)fVar68) * (int)fVar68 |
                   (uint)((int)fVar83 >= (int)fVar68) * (int)fVar83;
              auVar103._8_4_ =
                   (uint)((int)fVar84 < (int)fVar70) * (int)fVar70 |
                   (uint)((int)fVar84 >= (int)fVar70) * (int)fVar84;
              auVar103._12_4_ =
                   (uint)((int)fVar85 < (int)fVar72) * (int)fVar72 |
                   (uint)((int)fVar85 >= (int)fVar72) * (int)fVar85;
              auVar55._0_4_ =
                   (uint)((int)fVar109 < (int)fVar97) * (int)fVar97 |
                   (uint)((int)fVar109 >= (int)fVar97) * (int)fVar109;
              auVar55._4_4_ =
                   (uint)((int)fVar50 < (int)fVar99) * (int)fVar99 |
                   (uint)((int)fVar50 >= (int)fVar99) * (int)fVar50;
              auVar55._8_4_ =
                   (uint)((int)fVar52 < (int)fVar100) * (int)fVar100 |
                   (uint)((int)fVar52 >= (int)fVar100) * (int)fVar52;
              auVar55._12_4_ =
                   (uint)((int)fVar53 < (int)fVar96) * (int)fVar96 |
                   (uint)((int)fVar53 >= (int)fVar96) * (int)fVar53;
              auVar33 = minps(auVar103,auVar55);
              auVar60 = maxps(local_1058,auVar66);
              auVar60 = maxps(auVar60,auVar32);
              auVar40._4_4_ = fVar31;
              auVar40._0_4_ = fVar49;
              auVar40._8_4_ = fVar86;
              auVar40._12_4_ = fVar91;
              auVar16._4_4_ =
                   (uint)((int)fVar110 < (int)fVar105) * (int)fVar105 |
                   (uint)((int)fVar110 >= (int)fVar105) * (int)fVar110;
              auVar16._0_4_ =
                   (uint)((int)fVar92 < (int)fVar104) * (int)fVar104 |
                   (uint)((int)fVar92 >= (int)fVar104) * (int)fVar92;
              auVar16._8_4_ =
                   (uint)((int)fVar93 < (int)fVar106) * (int)fVar106 |
                   (uint)((int)fVar93 >= (int)fVar106) * (int)fVar93;
              auVar16._12_4_ =
                   (uint)((int)fVar94 < (int)fVar107) * (int)fVar107 |
                   (uint)((int)fVar94 >= (int)fVar107) * (int)fVar94;
              auVar32 = minps(auVar40,auVar16);
              auVar32 = minps(auVar32,auVar33);
              local_1108._0_4_ = auVar60._0_4_ * 0.99999964;
              local_1108._4_4_ = auVar60._4_4_ * 0.99999964;
              fStack_1100 = auVar60._8_4_ * 0.99999964;
              fStack_10fc = auVar60._12_4_ * 0.99999964;
              auVar56._4_4_ = -(uint)((float)local_1108._4_4_ <= auVar32._4_4_ * 1.0000004);
              auVar56._0_4_ = -(uint)((float)local_1108._0_4_ <= auVar32._0_4_ * 1.0000004);
              auVar56._8_4_ = -(uint)(fStack_1100 <= auVar32._8_4_ * 1.0000004);
              auVar56._12_4_ = -(uint)(fStack_10fc <= auVar32._12_4_ * 1.0000004);
              uVar27 = movmskps((int)unaff_R15,auVar56);
              unaff_R15 = CONCAT44(uVar28,uVar27);
              auVar32 = local_1058;
              fVar92 = local_1088;
              fVar108 = fStack_1084;
              fVar109 = fStack_1080;
              fVar110 = fStack_107c;
              fVar83 = local_1078;
              fVar50 = fStack_1074;
              fVar93 = fStack_1070;
              fVar84 = fStack_106c;
              fVar52 = local_10f8;
              fVar94 = fStack_10f4;
              fVar85 = fStack_10f0;
              fVar53 = fStack_10ec;
              fVar58 = local_1098;
              fVar59 = fStack_1094;
              fVar68 = fStack_1090;
              fVar69 = fStack_108c;
              fVar70 = local_10d8;
              fVar71 = fStack_10d4;
              fVar72 = fStack_10d0;
              fVar73 = fStack_10cc;
              fVar95 = local_10e8;
              fVar96 = fStack_10e4;
              fVar97 = fStack_10e0;
              fVar99 = fStack_10dc;
              fVar100 = local_1068;
              fVar104 = fStack_1064;
              fVar105 = fStack_1060;
              fVar106 = fStack_105c;
              local_10a8 = uVar10;
              uStack_10a0 = uVar18;
            }
            else {
              pfVar3 = (float *)(uVar19 + 0x80 + uVar22);
              pfVar1 = (float *)(uVar19 + 0x20 + uVar22);
              pfVar4 = (float *)(uVar19 + 0x80 + uVar25);
              pfVar2 = (float *)(uVar19 + 0x20 + uVar25);
              auVar61._0_4_ = ((*pfVar3 * fVar5 + *pfVar1) - fVar30) * fVar92;
              auVar61._4_4_ = ((pfVar3[1] * fVar5 + pfVar1[1]) - fVar30) * fVar108;
              auVar61._8_4_ = ((pfVar3[2] * fVar5 + pfVar1[2]) - fVar30) * fVar109;
              auVar61._12_4_ = ((pfVar3[3] * fVar5 + pfVar1[3]) - fVar30) * fVar110;
              auVar74._0_4_ = ((*pfVar4 * fVar5 + *pfVar2) - fVar51) * fVar58;
              auVar74._4_4_ = ((pfVar4[1] * fVar5 + pfVar2[1]) - fVar51) * fVar59;
              auVar74._8_4_ = ((pfVar4[2] * fVar5 + pfVar2[2]) - fVar51) * fVar68;
              auVar74._12_4_ = ((pfVar4[3] * fVar5 + pfVar2[3]) - fVar51) * fVar69;
              pfVar2 = (float *)(uVar19 + 0x80 + uVar26);
              pfVar1 = (float *)(uVar19 + 0x20 + uVar26);
              auVar35._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar52) * fVar83;
              auVar35._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar94) * fVar50;
              auVar35._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar85) * fVar93;
              auVar35._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar53) * fVar84;
              auVar33 = maxps(auVar74,auVar35);
              auVar60 = maxps(auVar32,auVar61);
              pfVar2 = (float *)(uVar19 + 0x80 + (uVar22 ^ 0x10));
              pfVar1 = (float *)(uVar19 + 0x20 + (uVar22 ^ 0x10));
              _local_1108 = maxps(auVar60,auVar33);
              auVar80._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar30) * fVar70;
              auVar80._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar30) * fVar71;
              auVar80._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar30) * fVar72;
              auVar80._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar30) * fVar73;
              pfVar3 = (float *)(uVar19 + 0x80 + (uVar25 ^ 0x10));
              pfVar1 = (float *)(uVar19 + 0x20 + (uVar25 ^ 0x10));
              pfVar4 = (float *)(uVar19 + 0x80 + (uVar26 ^ 0x10));
              pfVar2 = (float *)(uVar19 + 0x20 + (uVar26 ^ 0x10));
              auVar75._0_4_ = ((*pfVar3 * fVar5 + *pfVar1) - fVar51) * fVar95;
              auVar75._4_4_ = ((pfVar3[1] * fVar5 + pfVar1[1]) - fVar51) * fVar96;
              auVar75._8_4_ = ((pfVar3[2] * fVar5 + pfVar1[2]) - fVar51) * fVar97;
              auVar75._12_4_ = ((pfVar3[3] * fVar5 + pfVar1[3]) - fVar51) * fVar99;
              auVar62._0_4_ = ((*pfVar4 * fVar5 + *pfVar2) - fVar52) * fVar100;
              auVar62._4_4_ = ((pfVar4[1] * fVar5 + pfVar2[1]) - fVar94) * fVar104;
              auVar62._8_4_ = ((pfVar4[2] * fVar5 + pfVar2[2]) - fVar85) * fVar105;
              auVar62._12_4_ = ((pfVar4[3] * fVar5 + pfVar2[3]) - fVar53) * fVar106;
              auVar33 = minps(auVar75,auVar62);
              auVar63._4_4_ = fVar31;
              auVar63._0_4_ = fVar49;
              auVar63._8_4_ = fVar86;
              auVar63._12_4_ = fVar91;
              auVar60 = minps(auVar63,auVar80);
              auVar60 = minps(auVar60,auVar33);
              if (uVar21 == 6) {
                bVar12 = (fVar5 < *(float *)(uVar19 + 0xf0) && *(float *)(uVar19 + 0xe0) <= fVar5)
                         && local_1108._0_4_ <= auVar60._0_4_;
                bVar13 = (fVar5 < *(float *)(uVar19 + 0xf4) && *(float *)(uVar19 + 0xe4) <= fVar5)
                         && local_1108._4_4_ <= auVar60._4_4_;
                bVar14 = (fVar5 < *(float *)(uVar19 + 0xf8) && *(float *)(uVar19 + 0xe8) <= fVar5)
                         && local_1108._8_4_ <= auVar60._8_4_;
                bVar15 = (fVar5 < *(float *)(uVar19 + 0xfc) && *(float *)(uVar19 + 0xec) <= fVar5)
                         && local_1108._12_4_ <= auVar60._12_4_;
              }
              else {
                bVar12 = local_1108._0_4_ <= auVar60._0_4_;
                bVar13 = local_1108._4_4_ <= auVar60._4_4_;
                bVar14 = local_1108._8_4_ <= auVar60._8_4_;
                bVar15 = local_1108._12_4_ <= auVar60._12_4_;
              }
              auVar54._0_4_ = (uint)bVar12 * -0x80000000;
              auVar54._4_4_ = (uint)bVar13 * -0x80000000;
              auVar54._8_4_ = (uint)bVar14 * -0x80000000;
              auVar54._12_4_ = (uint)bVar15 * -0x80000000;
              uVar27 = movmskps((int)unaff_R15,auVar54);
              unaff_R15 = CONCAT44(uVar28,uVar27);
            }
          }
          if ((uVar20 & 8) == 0) {
            if (unaff_R15 == 0) {
              iVar29 = 4;
            }
            else {
              uVar19 = uVar20 & 0xfffffffffffffff0;
              lVar11 = 0;
              if (unaff_R15 != 0) {
                for (; (unaff_R15 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                }
              }
              iVar29 = 0;
              uVar20 = *(ulong *)(uVar19 + lVar11 * 8);
              uVar24 = unaff_R15 - 1 & unaff_R15;
              if (uVar24 != 0) {
                uVar21 = *(uint *)(local_1108 + lVar11 * 4);
                lVar11 = 0;
                if (uVar24 != 0) {
                  for (; (uVar24 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                  }
                }
                uVar9 = *(ulong *)(uVar19 + lVar11 * 8);
                uVar7 = *(uint *)(local_1108 + lVar11 * 4);
                uVar24 = uVar24 - 1 & uVar24;
                if (uVar24 == 0) {
                  if (uVar21 < uVar7) {
                    *(ulong *)*pauVar23 = uVar9;
                    *(uint *)((long)*pauVar23 + 8) = uVar7;
                    pauVar23 = pauVar23 + 1;
                  }
                  else {
                    *(ulong *)*pauVar23 = uVar20;
                    *(uint *)((long)*pauVar23 + 8) = uVar21;
                    uVar20 = uVar9;
                    pauVar23 = pauVar23 + 1;
                  }
                }
                else {
                  auVar57._8_4_ = uVar21;
                  auVar57._0_8_ = uVar20;
                  auVar57._12_4_ = 0;
                  auVar78._8_4_ = uVar7;
                  auVar78._0_8_ = uVar9;
                  auVar78._12_4_ = 0;
                  lVar11 = 0;
                  if (uVar24 != 0) {
                    for (; (uVar24 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                    }
                  }
                  uVar10 = *(undefined8 *)(uVar19 + lVar11 * 8);
                  iVar8 = *(int *)(local_1108 + lVar11 * 4);
                  auVar67._8_4_ = iVar8;
                  auVar67._0_8_ = uVar10;
                  auVar67._12_4_ = 0;
                  auVar41._8_4_ = -(uint)((int)uVar21 < (int)uVar7);
                  uVar24 = uVar24 - 1 & uVar24;
                  if (uVar24 == 0) {
                    auVar41._4_4_ = auVar41._8_4_;
                    auVar41._0_4_ = auVar41._8_4_;
                    auVar41._12_4_ = auVar41._8_4_;
                    auVar81._8_4_ = uVar7;
                    auVar81._0_8_ = uVar9;
                    auVar81._12_4_ = 0;
                    auVar33 = blendvps(auVar81,auVar57,auVar41);
                    auVar60 = blendvps(auVar57,auVar78,auVar41);
                    auVar42._8_4_ = -(uint)(auVar33._8_4_ < iVar8);
                    auVar42._4_4_ = auVar42._8_4_;
                    auVar42._0_4_ = auVar42._8_4_;
                    auVar42._12_4_ = auVar42._8_4_;
                    auVar79._8_4_ = iVar8;
                    auVar79._0_8_ = uVar10;
                    auVar79._12_4_ = 0;
                    auVar102 = blendvps(auVar79,auVar33,auVar42);
                    auVar82 = blendvps(auVar33,auVar67,auVar42);
                    auVar43._8_4_ = -(uint)(auVar60._8_4_ < auVar82._8_4_);
                    auVar43._4_4_ = auVar43._8_4_;
                    auVar43._0_4_ = auVar43._8_4_;
                    auVar43._12_4_ = auVar43._8_4_;
                    auVar33 = blendvps(auVar82,auVar60,auVar43);
                    auVar60 = blendvps(auVar60,auVar82,auVar43);
                    *pauVar23 = auVar60;
                    pauVar23[1] = auVar33;
                    uVar20 = auVar102._0_8_;
                    pauVar23 = pauVar23 + 2;
                  }
                  else {
                    lVar11 = 0;
                    if (uVar24 != 0) {
                      for (; (uVar24 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                      }
                    }
                    auVar44._4_4_ = auVar41._8_4_;
                    auVar44._0_4_ = auVar41._8_4_;
                    auVar44._8_4_ = auVar41._8_4_;
                    auVar44._12_4_ = auVar41._8_4_;
                    auVar82 = blendvps(auVar78,auVar57,auVar44);
                    auVar60 = blendvps(auVar57,auVar78,auVar44);
                    auVar89._8_4_ = *(int *)(local_1108 + lVar11 * 4);
                    auVar89._0_8_ = *(undefined8 *)(uVar19 + lVar11 * 8);
                    auVar89._12_4_ = 0;
                    auVar45._8_4_ = -(uint)(iVar8 < *(int *)(local_1108 + lVar11 * 4));
                    auVar45._4_4_ = auVar45._8_4_;
                    auVar45._0_4_ = auVar45._8_4_;
                    auVar45._12_4_ = auVar45._8_4_;
                    auVar102 = blendvps(auVar89,auVar67,auVar45);
                    auVar33 = blendvps(auVar67,auVar89,auVar45);
                    auVar46._8_4_ = -(uint)(auVar60._8_4_ < auVar33._8_4_);
                    auVar46._4_4_ = auVar46._8_4_;
                    auVar46._0_4_ = auVar46._8_4_;
                    auVar46._12_4_ = auVar46._8_4_;
                    auVar90 = blendvps(auVar33,auVar60,auVar46);
                    auVar60 = blendvps(auVar60,auVar33,auVar46);
                    auVar47._8_4_ = -(uint)(auVar82._8_4_ < auVar102._8_4_);
                    auVar47._4_4_ = auVar47._8_4_;
                    auVar47._0_4_ = auVar47._8_4_;
                    auVar47._12_4_ = auVar47._8_4_;
                    auVar33 = blendvps(auVar102,auVar82,auVar47);
                    auVar82 = blendvps(auVar82,auVar102,auVar47);
                    auVar48._8_4_ = -(uint)(auVar82._8_4_ < auVar90._8_4_);
                    auVar48._4_4_ = auVar48._8_4_;
                    auVar48._0_4_ = auVar48._8_4_;
                    auVar48._12_4_ = auVar48._8_4_;
                    auVar102 = blendvps(auVar90,auVar82,auVar48);
                    auVar82 = blendvps(auVar82,auVar90,auVar48);
                    *pauVar23 = auVar60;
                    pauVar23[1] = auVar82;
                    pauVar23[2] = auVar102;
                    uVar20 = auVar33._0_8_;
                    pauVar23 = pauVar23 + 3;
                    fVar70 = local_10d8;
                    fVar71 = fStack_10d4;
                    fVar72 = fStack_10d0;
                    fVar73 = fStack_10cc;
                    fVar95 = local_10e8;
                    fVar96 = fStack_10e4;
                    fVar97 = fStack_10e0;
                    fVar99 = fStack_10dc;
                  }
                }
              }
            }
          }
          else {
            iVar29 = 6;
          }
        } while (iVar29 == 0);
        if (iVar29 == 6) {
          (**(code **)((long)local_10b8->leafIntersector +
                      (ulong)*(byte *)(uVar20 & 0xfffffffffffffff0) * 0x40))
                    (local_fb8,ray,local_10b0);
          fVar49 = (local_10c0->super_RayK<1>).tfar;
          ray = local_10c0;
          fVar31 = fVar49;
          fVar86 = fVar49;
          fVar91 = fVar49;
          auVar32 = local_1058;
          fVar92 = local_1088;
          fVar108 = fStack_1084;
          fVar109 = fStack_1080;
          fVar110 = fStack_107c;
          fVar83 = local_1078;
          fVar50 = fStack_1074;
          fVar93 = fStack_1070;
          fVar84 = fStack_106c;
          fVar52 = local_10f8;
          fVar94 = fStack_10f4;
          fVar85 = fStack_10f0;
          fVar53 = fStack_10ec;
          fVar58 = local_1098;
          fVar59 = fStack_1094;
          fVar68 = fStack_1090;
          fVar69 = fStack_108c;
          fVar70 = local_10d8;
          fVar71 = fStack_10d4;
          fVar72 = fStack_10d0;
          fVar73 = fStack_10cc;
          fVar95 = local_10e8;
          fVar96 = fStack_10e4;
          fVar97 = fStack_10e0;
          fVar99 = fStack_10dc;
          fVar100 = local_1068;
          fVar104 = fStack_1064;
          fVar105 = fStack_1060;
          fVar106 = fStack_105c;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }